

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall
ptc::Print<char>::
print_backend<std::__cxx11::ostringstream&,std::__cxx11::list<int,std::allocator<int>>&>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          list<int,_std::allocator<int>_> *first)

{
  bool bVar1;
  ostream *os_00;
  enable_if_t<_is_streamable_v<list<int,_allocator<int>_>,_char>,_std::basic_ostream<char>_&> pbVar2
  ;
  byte local_51;
  ANSI local_40 [5];
  ANSI local_2c;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  list<int,_std::allocator<int>_> *first_local;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os_local;
  Print<char> *this_local;
  
  lock._M_device = (mutex_type *)first;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)mutex_);
  local_2c = first;
  bVar1 = is_escape<std::__cxx11::list<int,std::allocator<int>>>
                    ((list<int,_std::allocator<int>_> *)lock._M_device,&local_2c);
  local_51 = 1;
  if (!bVar1) {
    local_51 = std::__cxx11::string::empty();
  }
  if ((local_51 & 1) == 0) {
    os_00 = std::operator<<((ostream *)os,(string *)&this->pattern);
    pbVar2 = anon_unknown_8::operator<<<std::__cxx11::list,_int,_std::allocator<int>,_char>
                       (os_00,(list<int,_std::allocator<int>_> *)lock._M_device);
    std::operator<<(pbVar2,(string *)&this->pattern);
  }
  else {
    anon_unknown_8::operator<<<std::__cxx11::list,_int,_std::allocator<int>,_char>
              ((basic_ostream<char,_std::char_traits<char>_> *)os,
               (list<int,_std::allocator<int>_> *)lock._M_device);
  }
  std::operator<<((ostream *)os,(string *)this);
  local_40[0] = generic;
  bVar1 = is_escape<std::__cxx11::list<int,std::allocator<int>>>
                    ((list<int,_std::allocator<int>_> *)lock._M_device,local_40);
  if (bVar1) {
    std::operator<<((ostream *)os,"\x1b[0m");
  }
  if ((this->flush & 1U) != 0) {
    std::ostream::operator<<(os,std::flush<char,std::char_traits<char>>);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }